

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferQueryNegativeTest::iterate
          (MutableRenderBufferQueryNegativeTest *this)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  Library *pLVar4;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  EGLint curRenderBuffer;
  
  pLVar4 = EglTestContext::getLibrary
                     ((this->super_MutableRenderBufferTest).super_TestCase.m_eglTestCtx);
  curRenderBuffer = -1;
  (*pLVar4->_vptr_Library[0x2b])
            (pLVar4,(this->super_MutableRenderBufferTest).m_eglDisplay,
             (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,&curRenderBuffer);
  dVar1 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  eglu::checkError(dVar1,
                   "querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                   ,0x15b);
  if (curRenderBuffer == 0x3084) {
    iVar2 = (*pLVar4->_vptr_Library[0x30])
                      (pLVar4,(this->super_MutableRenderBufferTest).m_eglDisplay,
                       (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,0x3085);
    iVar3 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
    if (iVar2 == 0) {
      if (iVar3 == 0x3009) {
        (*pLVar4->_vptr_Library[0x2b])
                  (pLVar4,(this->super_MutableRenderBufferTest).m_eglDisplay,
                   (this->super_MutableRenderBufferTest).m_eglSurface,0x3086,&curRenderBuffer);
        dVar1 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
        eglu::checkError(dVar1,
                         "querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                         ,0x172);
        this_00 = (this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode
                  .m_testCtx;
        if (curRenderBuffer == 0x3084) {
          description = "Pass";
          testResult = QP_TEST_RESULT_PASS;
          goto LAB_0023c8f4;
        }
        description = "Surface didn\'t stay in back-buffered rendering after error";
      }
      else {
        this_00 = (this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode
                  .m_testCtx;
        description = 
        "eglSurfaceAttrib didn\'t set the EGL_BAD_MATCH error when trying to enable single-buffering on a context without the mutable render buffer bit set"
        ;
      }
    }
    else {
      this_00 = (this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx;
      description = 
      "eglSurfaceAttrib didn\'t return false when trying to enable single-buffering on a context without the mutable render buffer bit set"
      ;
    }
  }
  else {
    this_00 = (this->super_MutableRenderBufferTest).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Surface didn\'t default to back-buffered rendering";
  }
  testResult = QP_TEST_RESULT_FAIL;
LAB_0023c8f4:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

TestCase::IterateResult MutableRenderBufferQueryNegativeTest::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	// check that by default the query returns back buffered
	EGLint curRenderBuffer = -1;
	EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer));
	if (curRenderBuffer != EGL_BACK_BUFFER)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface didn't default to back-buffered rendering");
		return STOP;
	}

	// check that trying to switch to single-buffer rendering fails when the config bit is not set
	EGLBoolean ret = egl.surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER);
	EGLint err = egl.getError();
	if (ret != EGL_FALSE)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
			"eglSurfaceAttrib didn't return false when trying to enable single-buffering on a context without the mutable render buffer bit set");
		return STOP;
	}
	if (err != EGL_BAD_MATCH)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
			"eglSurfaceAttrib didn't set the EGL_BAD_MATCH error when trying to enable single-buffering on a context without the mutable render buffer bit set");
		return STOP;
	}

    EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, &curRenderBuffer));
    if (curRenderBuffer != EGL_BACK_BUFFER)
    {
        m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface didn't stay in back-buffered rendering after error");
        return STOP;
    }

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}